

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_lib.c
# Opt level: O1

void libdef_rec(BuildCtx *ctx,char *p,int arg)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  int iVar6;
  uint uVar7;
  char **__s;
  char **ppcVar8;
  char **ppcVar9;
  uint8_t *puVar10;
  long lVar11;
  long lVar12;
  double dVar13;
  char *pcStack_58;
  BuildCtx *pBStack_50;
  uint8_t *puStack_48;
  char **ppcStack_40;
  char *local_38;
  
  if (ctx->mode != BUILD_recdef) {
    return;
  }
  if (recffid + 1 < ffid) {
    do {
      ppcStack_40 = (char **)0x10b163;
      fwrite(",\n0",3,1,(FILE *)ctx->fp);
      iVar6 = recffid + 2;
      recffid = recffid + 1;
    } while (iVar6 < ffid);
  }
  ppcVar9 = (char **)funcname;
  if (*p != '.') {
    ppcVar9 = (char **)p;
  }
  __s = (char **)0x20;
  ppcStack_40 = (char **)0x10b1a1;
  recffid = ffid;
  pcVar4 = strchr((char *)ppcVar9,0x20);
  if (pcVar4 == (char *)0x0) {
    local_38 = (char *)0x0;
  }
  else {
    local_38 = pcVar4 + 1;
    *pcVar4 = '\0';
  }
  if (obuf[0] == '\0') {
    puVar10 = obuf;
    uVar7 = 2;
    lVar12 = 0;
  }
  else {
    uVar7 = 2;
    lVar12 = 0;
    puVar10 = obuf;
    do {
      ppcStack_40 = (char **)0x10b1ec;
      __s = ppcVar9;
      iVar6 = strcmp((char *)puVar10,(char *)ppcVar9);
      if (iVar6 == 0) goto LAB_0010b23a;
      ppcStack_40 = (char **)0x10b1f8;
      sVar5 = strlen((char *)puVar10);
      lVar11 = lVar12 + sVar5;
      lVar12 = lVar11 + 1;
      uVar7 = uVar7 + 1;
      puVar10 = obuf + lVar11 + 1;
      p = (char *)obuf;
    } while (obuf[lVar11 + 1] != '\0');
  }
  ppcStack_40 = (char **)0x10b224;
  ppcVar8 = ppcVar9;
  sVar5 = strlen((char *)ppcVar9);
  if ((long)(sVar5 + lVar12) < 0x1fff) {
    ppcStack_40 = (char **)0x10b23a;
    strcpy((char *)puVar10,(char *)ppcVar9);
LAB_0010b23a:
    if (local_38 != (char *)0x0) {
      fprintf((FILE *)ctx->fp,",\n0x%02x00+(%s)",(ulong)uVar7);
      return;
    }
    fprintf((FILE *)ctx->fp,",\n0x%02x00",(ulong)uVar7);
    return;
  }
  ppcStack_40 = (char **)libdef_push;
  libdef_rec_cold_1();
  if (*(int *)(ppcVar8 + 1) != 7) {
    return;
  }
  pcVar4 = (char *)__s;
  pBStack_50 = ctx;
  puStack_48 = (uint8_t *)p;
  ppcStack_40 = ppcVar9;
  sVar5 = strlen((char *)__s);
  iVar6 = (int)sVar5;
  if (*(char *)__s == '\"') {
    if ((1 < iVar6) && (*(char *)((long)__s + (ulong)(iVar6 - 1)) == '\"')) {
      *(undefined1 *)((long)__s + (ulong)(iVar6 - 1)) = 0;
      libdef_name((char *)((long)__s + 1),0xc0);
      return;
    }
    goto LAB_0010b3e0;
  }
  ppcVar9 = __s;
  if ((byte)(*(char *)__s - 0x30U) < 10) {
    pcVar4 = (char *)&pcStack_58;
    dVar13 = strtod((char *)__s,(char **)pcVar4);
    if (*pcStack_58 != '\0') goto LAB_0010b3e0;
    if (optr + 9 < (uint8_t *)((long)&optr + 1U)) {
      *optr = 0xfb;
      *(double *)(optr + 1) = dVar13;
      optr = optr + 9;
      return;
    }
LAB_0010b3e8:
    libdef_push_cold_3();
  }
  else {
    pcVar4 = "lastcl";
    iVar3 = strcmp((char *)__s,"lastcl");
    if (iVar3 == 0) {
      if (optr + 1 < (uint8_t *)((long)&optr + 1U)) {
        puVar10 = optr + 1;
        *optr = 0xfd;
        optr = puVar10;
        return;
      }
      goto LAB_0010b3f2;
    }
    if (iVar6 < 5) {
LAB_0010b3e0:
      libdef_push_cold_4();
      ppcVar9 = __s;
      goto LAB_0010b3e8;
    }
    pcVar4 = "top-";
    ppcVar9 = __s;
    iVar6 = strncmp((char *)__s,"top-",4);
    puVar10 = optr;
    if (iVar6 != 0) goto LAB_0010b3e0;
    puVar1 = optr + 2;
    if (puVar1 < (uint8_t *)((long)&optr + 1U)) {
      puVar2 = optr + 1;
      *optr = 0xfc;
      optr = puVar2;
      iVar6 = atoi((char *)((long)__s + 4));
      optr = puVar1;
      puVar10[1] = (uint8_t)iVar6;
      return;
    }
  }
  libdef_push_cold_1();
LAB_0010b3f2:
  libdef_push_cold_2();
  if (*(int *)(ppcVar9 + 1) == 7) {
    if ((*pcVar4 == '!') && (*(char *)((long)pcVar4 + 1) == '\0')) {
      *pcVar4 = 0;
    }
    libdef_name(pcVar4,0xc0);
    puVar10 = optr + 1;
    *optr = 0xfa;
    optr = puVar10;
    obuf[2] = obuf[2] + '\x01';
  }
  return;
}

Assistant:

static void libdef_rec(BuildCtx *ctx, char *p, int arg)
{
  UNUSED(arg);
  if (ctx->mode == BUILD_recdef) {
    char *q;
    uint32_t n;
    for (; recffid+1 < ffid; recffid++)
      fprintf(ctx->fp, ",\n0");
    recffid = ffid;
    if (*p == '.') p = funcname;
    q = strchr(p, ' ');
    if (q) *q++ = '\0';
    n = find_rec(p);
    if (q)
      fprintf(ctx->fp, ",\n0x%02x00+(%s)", n, q);
    else
      fprintf(ctx->fp, ",\n0x%02x00", n);
  }
}